

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O0

void __thiscall BmsNoteManager::DP_TO_SP(BmsNoteManager *this)

{
  barindex bar;
  bool bVar1;
  pointer ppVar2;
  int iVar3;
  _Self local_28;
  _Self local_20;
  Iterator it;
  int c;
  BmsNoteManager *this_local;
  
  for (it._M_node._4_4_ = 10; it._M_node._4_4_ < 0x14; it._M_node._4_4_ = it._M_node._4_4_ + 1) {
    local_20._M_node = (_Base_ptr)BmsNoteLane::Begin(this->lanes_ + it._M_node._4_4_);
    while( true ) {
      local_28._M_node = (_Base_ptr)BmsNoteLane::End(this->lanes_ + it._M_node._4_4_);
      bVar1 = std::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      iVar3 = it._M_node._4_4_ + -10;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_BmsNote>_>::operator->(&local_20);
      bar = ppVar2->first;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_BmsNote>_>::operator->(&local_20);
      BmsNoteLane::Set(this->lanes_ + iVar3,bar,&ppVar2->second);
      std::_Rb_tree_iterator<std::pair<const_int,_BmsNote>_>::operator++(&local_20);
    }
    BmsNoteLane::Clear(this->lanes_ + it._M_node._4_4_);
  }
  FixIncorrectLongNote(this);
  return;
}

Assistant:

void BmsNoteManager::DP_TO_SP() {
	// just merge note at first
	for (int c = 10; c < 20; c++) {
		for (auto it = lanes_[c].Begin(); it != lanes_[c].End(); ++it) {
			lanes_[c - 10].Set(it->first, it->second);
		}
		lanes_[c].Clear();
	}

	// after merge, check LN validation.
	FixIncorrectLongNote();
}